

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hh
# Opt level: O1

void __thiscall xt::RuntimeException::~RuntimeException(RuntimeException *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__RuntimeException_0010cbe0;
  pcVar1 = (this->data)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->data).field_2) {
    operator_delete(pcVar1);
  }
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

RuntimeException(const std::string& error) : data(error) {}